

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_t * server_process_rcvd_pcp_msg(pcp_server_t *s,pcp_recv_msg_t *msg)

{
  pcp_flow_t *f;
  
  if (msg->recv_version == 0) {
    if ((msg->kd).operation == '\0') {
      s->natpmp_ext_addr = (msg->assigned_ext_ip).__in6_u.__u6_addr32[3];
      if (((s->pcp_version != '\0') || (f = s->ping_flow_msg, f == (pcp_flow_t *)0x0)) ||
         ((f->kd).operation != '\0')) goto LAB_001056ee;
      goto LAB_001056b4;
    }
    (msg->assigned_ext_ip).__in6_u.__u6_addr32[3] = s->natpmp_ext_addr;
    (msg->assigned_ext_ip).__in6_u.__u6_addr32[2] = 0xffff0000;
    *(undefined8 *)&(msg->assigned_ext_ip).__in6_u = 0;
  }
  f = pcp_get_flow(&msg->kd,s);
  if (f == (pcp_flow_t *)0x0) {
LAB_001056ee:
    pcp_logger(PCP_LOGLVL_INFO,"%s","Couldn\'t find matching flow to received PCP message.");
    return (pcp_flow_t *)0x0;
  }
LAB_001056b4:
  pcp_logger(PCP_LOGLVL_INFO,"Found matching flow %d to received PCP message.",(ulong)f->key_bucket)
  ;
  handle_flow_event(f,msg->recv_result + FEV_RES_BEGIN,msg);
  return f;
}

Assistant:

static pcp_flow_t *server_process_rcvd_pcp_msg(pcp_server_t *s,
                                               pcp_recv_msg_t *msg) {
    pcp_flow_t *f;
#ifndef PCP_DISABLE_NATPMP
    if (msg->recv_version == 0) {
        if (msg->kd.operation == NATPMP_OPCODE_ANNOUNCE) {
            s->natpmp_ext_addr = S6_ADDR32(&msg->assigned_ext_ip)[3];
            if ((s->pcp_version == 0) && (s->ping_flow_msg) &&
                (s->ping_flow_msg->kd.operation == PCP_OPCODE_ANNOUNCE)) {
                f = s->ping_flow_msg;
            } else {
                f = NULL;
            }
        } else {
            S6_ADDR32(&msg->assigned_ext_ip)[3] = s->natpmp_ext_addr;
            S6_ADDR32(&msg->assigned_ext_ip)[2] = htonl(0xFFFF);
            S6_ADDR32(&msg->assigned_ext_ip)[1] = 0;
            S6_ADDR32(&msg->assigned_ext_ip)[0] = 0;

            f = pcp_get_flow(&msg->kd, s);
        }
    } else {
        f = pcp_get_flow(&msg->kd, s);
    }
#else
    f = pcp_get_flow(&msg->kd, s);
#endif

    if (!f) {
        char in6[INET6_ADDRSTRLEN];

        PCP_LOG(PCP_LOGLVL_INFO, "%s",
                "Couldn't find matching flow to received PCP message.");
        PCP_LOG(PCP_LOGLVL_PERR, "  Operation   : %u", msg->kd.operation);
        if ((msg->kd.operation == PCP_OPCODE_MAP) ||
            (msg->kd.operation == PCP_OPCODE_PEER)) {
            PCP_LOG(PCP_LOGLVL_PERR, "  Protocol    : %u",
                    msg->kd.map_peer.protocol);
            PCP_LOG(PCP_LOGLVL_PERR, "  Source      : %s:%hu",
                    inet_ntop(s->af, &msg->kd.src_ip, in6, sizeof(in6)),
                    ntohs(msg->kd.map_peer.src_port));
            PCP_LOG(
                PCP_LOGLVL_PERR, "  Destination : %s:%hu",
                inet_ntop(s->af, &msg->kd.map_peer.dst_ip, in6, sizeof(in6)),
                ntohs(msg->kd.map_peer.dst_port));
        } else {
            // TODO: add print of SADSCP params
        }
        return NULL;
    }

    PCP_LOG(PCP_LOGLVL_INFO, "Found matching flow %d to received PCP message.",
            f->key_bucket);

    handle_flow_event(f, FEV_RES_BEGIN + msg->recv_result, msg);

    return f;
}